

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip.h
# Opt level: O0

int bip_request_read(uint32_t *off,uint32_t *size,bip *buffer)

{
  uint uVar1;
  bool bVar2;
  uint32_t local_58;
  uint32_t local_54;
  uint local_50;
  uint local_40;
  uint32_t available;
  uint32_t write;
  uint uStack_34;
  char full_r2;
  uint32_t write_;
  uint32_t read;
  bip *buffer_local;
  uint32_t *size_local;
  uint32_t *off_local;
  
  uVar1 = buffer->read;
  uStack_34 = buffer->write;
  local_40 = uStack_34 & 0x7fffffff;
  if ((int)uStack_34 < 0) {
    local_50 = buffer->size - uVar1;
    if (local_50 == 0) {
      if (local_40 == 0) {
        *size = 0;
        *off = 0;
        return 0;
      }
      while( true ) {
        LOCK();
        bVar2 = uStack_34 == buffer->write;
        if (bVar2) {
          buffer->write = local_40;
        }
        UNLOCK();
        if (bVar2) break;
        uStack_34 = buffer->write;
        local_40 = uStack_34 & 0x7fffffff;
      }
      if (*size < local_40) {
        local_54 = *size;
      }
      else {
        local_54 = local_40;
      }
      *size = local_54;
      *off = 0;
      LOCK();
      buffer->read = 0;
      UNLOCK();
    }
    else {
      if (*size < local_50) {
        local_50 = *size;
      }
      *size = local_50;
      *off = uVar1;
    }
  }
  else {
    if (local_40 <= uVar1) {
      *size = 0;
      *off = 0;
      return 0;
    }
    if (*size < local_40 - uVar1) {
      local_58 = *size;
    }
    else {
      local_58 = local_40 - uVar1;
    }
    *size = local_58;
    *off = uVar1;
  }
  return 1;
}

Assistant:

static inline int bip_request_read(uint32_t *off, uint32_t *size, struct bip *buffer){
  read_buffer_state(read, write, full_r2, buffer);
  if(full_r2){
    uint32_t available = buffer->size - read;
    if(0 < available){
      *size = MIN(*size, available);
      *off = read;
    }else if(0 < write){ // We are at the end and need to wrap now.
    retry:
      if(!atomic_cas(buffer->write, write_, write)){
        write_ = atomic_read(buffer->write);
        write = write_ & 0x7FFFFFFF;
        goto retry;
      }
      *size = MIN(*size, write);
      *off = 0;
      atomic_write(buffer->read, 0);
    }else{ // Write has not done anything yet, no space!
      *size = 0;
      *off = 0;
      debug_log("%p Underrun", (void*)buffer);
      return 0;
    }
  }else if(read < write){
    *size = MIN(*size, write-read);
    *off = read;
  }else{
    *size = 0;
    *off = 0;
    debug_log("%p Underrun", (void*)buffer);
    return 0;
  }
  return 1;
}